

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_op.h
# Opt level: O2

Nonnull<const_char_*>
absl::lts_20250127::log_internal::MakeCheckOpString<signed_char_const*,signed_char_const*>
          (char *v1,char *v2,Nonnull<const_char_*> exprtext)

{
  Nonnull<const_char_*> pcVar1;
  CheckOpMessageBuilder comb;
  char *local_198;
  char *local_190;
  CheckOpMessageBuilder local_188;
  
  local_198 = v2;
  local_190 = v1;
  CheckOpMessageBuilder::CheckOpMessageBuilder(&local_188,exprtext);
  MakeCheckOpValueString<signed_char_const*>((ostream *)&local_188,&local_190);
  CheckOpMessageBuilder::ForVar2(&local_188);
  MakeCheckOpValueString<signed_char_const*>((ostream *)&local_188,&local_198);
  pcVar1 = CheckOpMessageBuilder::NewString(&local_188);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_188);
  return pcVar1;
}

Assistant:

absl::Nonnull<const char*> MakeCheckOpString(
    T1 v1, T2 v2, absl::Nonnull<const char*> exprtext) {
  CheckOpMessageBuilder comb(exprtext);
  MakeCheckOpValueString(comb.ForVar1(), v1);
  MakeCheckOpValueString(comb.ForVar2(), v2);
  return comb.NewString();
}